

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clump.cpp
# Opt level: O3

Stream * rw::writeAtomicRights
                   (Stream *stream,int32 param_2,void *object,int32 param_4,int32 param_5)

{
  undefined8 local_10;
  
  local_10 = **(undefined8 **)((long)object + 0x68);
  Stream::write32(stream,&local_10,8);
  return stream;
}

Assistant:

static Stream*
writeAtomicRights(Stream *stream, int32, void *object, int32, int32)
{
	Atomic *atomic = (Atomic*)object;
	uint32 buffer[2];
	buffer[0] = atomic->pipeline->pluginID;
	buffer[1] = atomic->pipeline->pluginData;
	stream->write32(buffer, 8);
	return stream;
}